

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::reset
          (basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          binary_stream_sink *sink)

{
  pointer psVar1;
  pointer puVar2;
  uint8_t *puVar3;
  
  (this->sink_).stream_ptr_ = sink->stream_ptr_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->sink_).buffer_,&sink->buffer_);
  (this->sink_).p_ = sink->p_;
  puVar3 = sink->end_buffer_;
  (this->sink_).begin_buffer_ = sink->begin_buffer_;
  (this->sink_).end_buffer_ = puVar3;
  psVar1 = (this->stack_).
           super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    (this->stack_).
    super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1;
  }
  puVar2 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  this->nesting_depth_ = 0;
  return;
}

Assistant:

void reset(Sink&& sink)
    {
        sink_ = std::move(sink);
        reset();
    }